

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall
cmQtAutoMocUic::JobGenerateT::UicUpdate(JobGenerateT *this,MappingT *mapping,string *reason)

{
  bool bVar1;
  element_type *text;
  UicSettingsT *pUVar2;
  element_type *peVar3;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_60;
  cmFileTime local_40;
  cmFileTime outputFileTime;
  string *outputFile;
  string *sourceFile;
  string *reason_local;
  MappingT *mapping_local;
  JobGenerateT *this_local;
  
  text = std::
         __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mapping);
  outputFileTime.NS = (NSC)&mapping->OutputFile;
  cmFileTime::cmFileTime(&local_40);
  bVar1 = cmFileTime::Load(&local_40,(string *)outputFileTime.NS);
  if (bVar1) {
    pUVar2 = JobT::UicConst((JobT *)this);
    if ((pUVar2->SettingsChanged & 1U) == 0) {
      peVar3 = std::
               __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)mapping);
      bVar1 = cmFileTime::Older(&local_40,&peVar3->FileTime);
      if (bVar1) {
        if (reason != (string *)0x0) {
          std::__cxx11::string::operator=((string *)reason,"Generating ");
          cmQtAutoGen::Quoted(&local_f0,(string *)outputFileTime.NS);
          std::__cxx11::string::operator+=((string *)reason,(string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::operator+=
                    ((string *)reason," because it\'s older than the source file ");
          cmQtAutoGen::Quoted(&local_110,&text->FileName);
          std::__cxx11::string::operator+=((string *)reason,(string *)&local_110);
          std::__cxx11::string::~string((string *)&local_110);
        }
        this_local._7_1_ = true;
      }
      else {
        pUVar2 = JobT::UicConst((JobT *)this);
        bVar1 = cmFileTime::Older(&local_40,&pUVar2->ExecutableTime);
        if (bVar1) {
          if (reason != (string *)0x0) {
            std::__cxx11::string::operator=((string *)reason,"Generating ");
            cmQtAutoGen::Quoted(&local_130,(string *)outputFileTime.NS);
            std::__cxx11::string::operator+=((string *)reason,(string *)&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::operator+=
                      ((string *)reason,", because it\'s older than the uic executable, from ");
            cmQtAutoGen::Quoted(&local_150,&text->FileName);
            std::__cxx11::string::operator+=((string *)reason,(string *)&local_150);
            std::__cxx11::string::~string((string *)&local_150);
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      if (reason != (string *)0x0) {
        std::__cxx11::string::operator=((string *)reason,"Generating ");
        cmQtAutoGen::Quoted(&local_b0,(string *)outputFileTime.NS);
        std::__cxx11::string::operator+=((string *)reason,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::operator+=
                  ((string *)reason,", because the uic settings changed, from ");
        cmQtAutoGen::Quoted(&local_d0,&text->FileName);
        std::__cxx11::string::operator+=((string *)reason,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    if (reason != (string *)0x0) {
      std::__cxx11::string::operator=((string *)reason,"Generating ");
      cmQtAutoGen::Quoted(&local_60,(string *)outputFileTime.NS);
      std::__cxx11::string::operator+=((string *)reason,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::operator+=((string *)reason,", because it doesn\'t exist, from ");
      cmQtAutoGen::Quoted(&local_90,&text->FileName);
      std::__cxx11::string::operator+=((string *)reason,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoMocUic::JobGenerateT::UicUpdate(MappingT const& mapping,
                                             std::string* reason) const
{
  std::string const& sourceFile = mapping.SourceFile->FileName;
  std::string const& outputFile = mapping.OutputFile;

  // Test if the build file exists
  cmFileTime outputFileTime;
  if (!outputFileTime.Load(outputFile)) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += ", because it doesn't exist, from ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  // Test if the uic settings changed
  if (UicConst().SettingsChanged) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += ", because the uic settings changed, from ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  // Test if the source file is newer
  if (outputFileTime.Older(mapping.SourceFile->FileTime)) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += " because it's older than the source file ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  // Test if the uic executable is newer
  if (outputFileTime.Older(UicConst().ExecutableTime)) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += ", because it's older than the uic executable, from ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  return false;
}